

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  double local_48;
  int local_40;
  int local_3c;
  int height;
  int width;
  double t_old;
  double dt_total;
  double t;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  t = (double)glfwCreateWindow(0x280,0x1e0,"Wave Simulation",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if ((GLFWwindow *)t == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwSetKeyCallback((GLFWwindow *)t,key_callback);
  glfwSetFramebufferSizeCallback((GLFWwindow *)t,framebuffer_size_callback);
  glfwSetMouseButtonCallback((GLFWwindow *)t,mouse_button_callback);
  glfwSetCursorPosCallback((GLFWwindow *)t,cursor_position_callback);
  glfwSetScrollCallback((GLFWwindow *)t,scroll_callback);
  glfwMakeContextCurrent((GLFWwindow *)t);
  glfwSwapInterval(1);
  glfwGetFramebufferSize((GLFWwindow *)t,&local_3c,&local_40);
  framebuffer_size_callback((GLFWwindow *)t,local_3c,local_40);
  init_opengl();
  init_vertices();
  init_grid();
  adjust_grid();
  _height = glfwGetTime();
  _height = _height - 0.01;
  while( true ) {
    iVar1 = glfwWindowShouldClose((GLFWwindow *)t);
    if (iVar1 != 0) break;
    dt_total = glfwGetTime();
    t_old = dt_total - _height;
    _height = dt_total;
    while (0.0 < t_old) {
      if (t_old <= 0.01) {
        local_48 = t_old;
      }
      else {
        local_48 = 0.01;
      }
      dt = local_48;
      t_old = t_old - local_48;
      calc_grid();
    }
    adjust_grid();
    draw_scene((GLFWwindow *)t);
    glfwPollEvents();
  }
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
    GLFWwindow* window;
    double t, dt_total, t_old;
    int width, height;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Wave Simulation", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetMouseButtonCallback(window, mouse_button_callback);
    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetScrollCallback(window, scroll_callback);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    glfwGetFramebufferSize(window, &width, &height);
    framebuffer_size_callback(window, width, height);

    // Initialize OpenGL
    init_opengl();

    // Initialize simulation
    init_vertices();
    init_grid();
    adjust_grid();

    // Initialize timer
    t_old = glfwGetTime() - 0.01;

    while (!glfwWindowShouldClose(window))
    {
        t = glfwGetTime();
        dt_total = t - t_old;
        t_old = t;

        // Safety - iterate if dt_total is too large
        while (dt_total > 0.f)
        {
            // Select iteration time step
            dt = dt_total > MAX_DELTA_T ? MAX_DELTA_T : dt_total;
            dt_total -= dt;

            // Calculate wave propagation
            calc_grid();
        }

        // Compute height of each vertex
        adjust_grid();

        // Draw wave grid to OpenGL display
        draw_scene(window);

        glfwPollEvents();
    }

    exit(EXIT_SUCCESS);
}